

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::ParseNode_Metadata
          (X3DImporter *this,CX3DImporter_NodeElement *pParentElement,string *param_2)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator<char> local_41;
  string local_40;
  
  ParseHelper_Node_Enter(this,pParentElement);
  do {
    do {
      while( true ) {
        iVar2 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          iVar2 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,(char *)CONCAT44(extraout_var_01,iVar2),&local_41);
          Throw_CloseNotFound(this,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
          goto LAB_00558940;
        }
        iVar2 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
        if (!bVar1) {
          iVar2 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,(char *)CONCAT44(extraout_var,iVar2),&local_41);
          XML_CheckNode_SkipUnsupported(this,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      iVar2 = (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,(char *)CONCAT44(extraout_var_00,iVar2),&local_41);
    bVar1 = XML_CheckNode_NameEqual(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  } while (!bVar1);
LAB_00558940:
  ParseHelper_Node_Exit(this);
  return;
}

Assistant:

void X3DImporter::ParseNode_Metadata(CX3DImporter_NodeElement* pParentElement, const std::string& /*pNodeName*/)
{
	ParseHelper_Node_Enter(pParentElement);
	MACRO_NODECHECK_METADATA(mReader->getNodeName());
	ParseHelper_Node_Exit();
}